

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode addReference(UA_Server *server,UA_Session *session,UA_AddReferencesItem *item)

{
  UA_StatusCode UVar1;
  UA_NodeStoreEntry **ppUVar2;
  UA_AddReferencesItem *in_RCX;
  UA_DeleteReferencesItem *item_00;
  UA_Node *node;
  UA_Node *node_00;
  UA_Node *node_01;
  UA_Server *pUVar3;
  UA_NodeId local_118;
  UA_Byte *local_100;
  size_t sStack_f8;
  UA_Byte *local_f0;
  ulong local_e8;
  UA_Byte *pUStack_e0;
  undefined8 local_d8;
  size_t sStack_d0;
  UA_Byte *local_c8;
  size_t sStack_c0;
  UA_Byte *local_b8;
  size_t sStack_b0;
  UA_String *local_a8;
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  UA_DeleteReferencesItem deleteItem;
  
  UVar1 = 0x80400000;
  if ((session->clientDescription).applicationName.text.data == (UA_Byte *)0x0) {
    ppUVar2 = findNode(server->nodestore,(UA_NodeId *)session);
    if (ppUVar2 == (UA_NodeStoreEntry **)0x0) {
      pUVar3 = (UA_Server *)0x0;
    }
    else {
      pUVar3 = (UA_Server *)&(*ppUVar2)->node;
    }
    if (pUVar3 == (UA_Server *)0x0) {
      UVar1 = 0x80340000;
    }
    else {
      UVar1 = addOneWayReference(pUVar3,session,node,in_RCX);
    }
    if (UVar1 == 0) {
      local_118.identifier.string.data =
           (UA_Byte *)(session->clientDescription).discoveryProfileUri.length;
      local_118._0_8_ = (session->clientDescription).gatewayServerUri.length;
      local_118.identifier.string.length =
           (size_t)(session->clientDescription).gatewayServerUri.data;
      pUStack_e0 = (UA_Byte *)0x0;
      local_d8._0_4_ = UA_APPLICATIONTYPE_SERVER;
      local_d8._4_4_ = 0;
      local_b8 = (UA_Byte *)0x0;
      sStack_b0 = 0;
      local_a8 = (UA_String *)0x0;
      uStack_a0._0_1_ = false;
      uStack_a0._1_7_ = 0;
      local_f0 = (session->clientDescription).applicationName.locale.data;
      local_100 = (session->clientDescription).productUri.data;
      sStack_f8 = (session->clientDescription).applicationName.locale.length;
      local_e8 = (ulong)(byte)(session->clientDescription).applicationName.text.length ^ 1;
      sStack_c0 = (session->clientDescription).productUri.length;
      sStack_d0 = (session->clientDescription).applicationUri.length;
      local_c8 = (session->clientDescription).applicationUri.data;
      ppUVar2 = findNode(server->nodestore,&local_118);
      if (ppUVar2 == (UA_NodeStoreEntry **)0x0) {
        pUVar3 = (UA_Server *)0x0;
      }
      else {
        pUVar3 = (UA_Server *)&(*ppUVar2)->node;
      }
      if (pUVar3 == (UA_Server *)0x0) {
        UVar1 = 0x80340000;
      }
      else {
        UVar1 = addOneWayReference(pUVar3,(UA_Session *)&local_118,node_00,in_RCX);
      }
      if (UVar1 != 0) {
        deleteItem.sourceNodeId.identifier.string.length =
             (session->clientDescription).productUri.length;
        auStack_98 = (undefined1  [8])(session->clientDescription).applicationUri.length;
        deleteItem.sourceNodeId._0_8_ = (session->clientDescription).applicationUri.data;
        deleteItem.sourceNodeId.identifier.string.data =
             (session->clientDescription).productUri.data;
        deleteItem.referenceTypeId._0_8_ =
             (session->clientDescription).applicationName.locale.length;
        deleteItem.referenceTypeId.identifier.string.length =
             (size_t)(session->clientDescription).applicationName.locale.data;
        deleteItem.referenceTypeId.identifier.guid.data4[0] =
             (UA_Byte)(session->clientDescription).applicationName.text.length;
        item_00 = (UA_DeleteReferencesItem *)
                  CONCAT71((int7)(deleteItem.referenceTypeId.identifier.string.length >> 8),
                           deleteItem.referenceTypeId.identifier.guid.data4[0]);
        deleteItem._48_8_ = (session->clientDescription).gatewayServerUri.length;
        deleteItem.targetNodeId.nodeId._0_8_ = (session->clientDescription).gatewayServerUri.data;
        deleteItem.targetNodeId.nodeId.identifier.string.length =
             (session->clientDescription).discoveryProfileUri.length;
        deleteItem.targetNodeId.nodeId.identifier.string.data =
             (session->clientDescription).discoveryProfileUri.data;
        deleteItem.targetNodeId.namespaceUri.length = (session->clientDescription).discoveryUrlsSize
        ;
        deleteItem.targetNodeId.namespaceUri.data =
             (UA_Byte *)(session->clientDescription).discoveryUrls;
        deleteItem.targetNodeId.serverIndex._0_1_ = 0;
        ppUVar2 = findNode(server->nodestore,(UA_NodeId *)session);
        if (ppUVar2 == (UA_NodeStoreEntry **)0x0) {
          pUVar3 = (UA_Server *)0x0;
        }
        else {
          pUVar3 = (UA_Server *)&(*ppUVar2)->node;
        }
        if (pUVar3 != (UA_Server *)0x0) {
          deleteOneWayReference(pUVar3,(UA_Session *)auStack_98,node_01,item_00);
        }
      }
    }
  }
  return UVar1;
}

Assistant:

static UA_StatusCode
addReference(UA_Server *server, UA_Session *session,
             const UA_AddReferencesItem *item) {
    /* Currently no expandednodeids are allowed */
    if(item->targetServerUri.length > 0)
        return UA_STATUSCODE_BADNOTIMPLEMENTED;

    /* Add the first direction */
#ifndef UA_ENABLE_EXTERNAL_NAMESPACES
    UA_StatusCode retval = UA_Server_editNode(server, session, &item->sourceNodeId,
                                              (UA_EditNodeCallback)addOneWayReference,
                                              item);
#else
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_Boolean handledExternally = UA_FALSE;
    for(size_t j = 0; j <server->externalNamespacesSize; ++j) {
        if(item->sourceNodeId.namespaceIndex != server->externalNamespaces[j].index) {
            continue;
        } else {
            UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
            retval = (UA_StatusCode)ens->addOneWayReference(ens->ensHandle, item);
            handledExternally = UA_TRUE;
            break;
        }
    }
    if(!handledExternally)
        retval = UA_Server_editNode(server, session, &item->sourceNodeId,
                                    (UA_EditNodeCallback)addOneWayReference, item);
#endif

    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Add the second direction */
    UA_AddReferencesItem secondItem;
    UA_AddReferencesItem_init(&secondItem);
    secondItem.sourceNodeId = item->targetNodeId.nodeId;
    secondItem.referenceTypeId = item->referenceTypeId;
    secondItem.isForward = !item->isForward;
    secondItem.targetNodeId.nodeId = item->sourceNodeId;
    /* keep default secondItem.targetNodeClass = UA_NODECLASS_UNSPECIFIED */
#ifndef UA_ENABLE_EXTERNAL_NAMESPACES
    retval = UA_Server_editNode(server, session, &secondItem.sourceNodeId,
                                (UA_EditNodeCallback)addOneWayReference, &secondItem);
#else
    handledExternally = UA_FALSE;
    for(size_t j = 0; j < server->externalNamespacesSize; ++j) {
        if(secondItem.sourceNodeId.namespaceIndex != server->externalNamespaces[j].index) {
            continue;
        } else {
            UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
            retval = (UA_StatusCode)ens->addOneWayReference(ens->ensHandle, &secondItem);
            handledExternally = UA_TRUE;
            break;
        }
    }
    if(!handledExternally)
        retval = UA_Server_editNode(server, session, &secondItem.sourceNodeId,
                                    (UA_EditNodeCallback)addOneWayReference, &secondItem);
#endif

    /* remove reference if the second direction failed */
    if(retval != UA_STATUSCODE_GOOD) {
        UA_DeleteReferencesItem deleteItem;
        deleteItem.sourceNodeId = item->sourceNodeId;
        deleteItem.referenceTypeId = item->referenceTypeId;
        deleteItem.isForward = item->isForward;
        deleteItem.targetNodeId = item->targetNodeId;
        deleteItem.deleteBidirectional = false;
        /* ignore returned status code */
        UA_Server_editNode(server, session, &item->sourceNodeId,
                           (UA_EditNodeCallback)deleteOneWayReference, &deleteItem);
    }
    return retval;
}